

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

void __thiscall
NativeEntryPointData::Cleanup
          (NativeEntryPointData *this,ScriptContext *scriptContext,bool isShutdown,bool reset)

{
  bool bVar1;
  JITManager *this_00;
  BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar2;
  BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  SListCounted<Js::ConstructorCache_*,_Memory::Recycler> **ppSVar3;
  SList<Js::ConstructorCache_*,_Memory::Recycler,_RealCount> *this_02;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  byte local_1a;
  byte local_19;
  bool reset_local;
  ScriptContext *pSStack_18;
  bool isShutdown_local;
  ScriptContext *scriptContext_local;
  NativeEntryPointData *this_local;
  
  local_1a = reset;
  local_19 = isShutdown;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  FreeJitTransferData(this);
  FreeNativeCode(this,pSStack_18,(bool)(local_19 & 1));
  this_00 = JITManager::GetJITManager();
  bVar1 = JITManager::IsOOPJITEnabled(this_00);
  if (bVar1) {
    OOPNativeEntryPointData::OnCleanup((OOPNativeEntryPointData *)this);
  }
  else {
    InProcNativeEntryPointData::OnCleanup((InProcNativeEntryPointData *)this);
  }
  ClearTypeRefsAndGuards(this,pSStack_18);
  ppBVar2 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                      ((WriteBarrierPtr *)&this->sharedPropertyGuards);
  if (*ppBVar2 !=
      (BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    if ((local_1a & 1) == 0) {
      this_01 = Memory::
                WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                ::operator->(&this->sharedPropertyGuards);
      JsUtil::
      BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Clear(this_01);
    }
    local_28 = (nullptr_t)0x0;
    Memory::
    WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::PropertyGuard_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::operator=(&this->sharedPropertyGuards,&local_28);
  }
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SListCounted__
                      ((WriteBarrierPtr *)&this->constructorCaches);
  if (*ppSVar3 != (SListCounted<Js::ConstructorCache_*,_Memory::Recycler> *)0x0) {
    if ((local_1a & 1) == 0) {
      this_02 = &Memory::WriteBarrierPtr<SListCounted<Js::ConstructorCache_*,_Memory::Recycler>_>::
                 operator->(&this->constructorCaches)->
                 super_SList<Js::ConstructorCache_*,_Memory::Recycler,_RealCount>;
      SList<Js::ConstructorCache_*,_Memory::Recycler,_RealCount>::Clear(this_02);
    }
    local_30 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<SListCounted<Js::ConstructorCache_*,_Memory::Recycler>_>::operator=
              (&this->constructorCaches,&local_30);
  }
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::EntryPointPolymorphicInlineCacheInfo>::operator=
            (&this->polymorphicInlineCacheInfo,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::BaseHashSet<Memory::RecyclerWeakReference<Js::FunctionBody>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Memory::RecyclerWeakReference<Js::FunctionBody>_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::operator=(&this->weakFuncRefSet,&local_40);
  if (this->nativeThrowSpanSequence != (Type)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::SmallSpanSequence>
              (&Memory::HeapAllocator::Instance,this->nativeThrowSpanSequence);
    this->nativeThrowSpanSequence = (Type)0x0;
  }
  JsUtil::
  List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Reset(&this->nativeOffsetMaps);
  return;
}

Assistant:

void
NativeEntryPointData::Cleanup(ScriptContext * scriptContext, bool isShutdown, bool reset)
{    
    this->FreeJitTransferData();
    this->FreeNativeCode(scriptContext, isShutdown);

    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        ((OOPNativeEntryPointData *)this)->OnCleanup();
    }
    else
    {
        ((InProcNativeEntryPointData *)this)->OnCleanup();
    }

    this->ClearTypeRefsAndGuards(scriptContext);

    if (this->sharedPropertyGuards != nullptr)
    {
        // Reset can be called on the background thread, don't clear it explicitly
        if (!reset)
        {
            sharedPropertyGuards->Clear();
        }
        sharedPropertyGuards = nullptr;
    }

    if (this->constructorCaches != nullptr)
    {
        // Reset can be called on the background thread, don't clear it explicitly
        if (!reset)
        {
            this->constructorCaches->Clear();
        }
        this->constructorCaches = nullptr;
    }

    this->polymorphicInlineCacheInfo = nullptr;
    this->weakFuncRefSet = nullptr;

    if (this->nativeThrowSpanSequence)
    {
        HeapDelete(this->nativeThrowSpanSequence);
        this->nativeThrowSpanSequence = nullptr;
    }

#if DBG_DUMP | defined(VTUNE_PROFILING)
    this->nativeOffsetMaps.Reset();
#endif
}